

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::incoming_allowed_fast(peer_connection *this,piece_index_t index)

{
  int iVar1;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var2;
  iterator __position;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  char cVar3;
  download_priority_t dVar4;
  undefined4 in_EAX;
  int iVar5;
  piece_index_t pVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint uVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  element_type *this_02;
  bool bVar10;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT44(index.m_val,in_EAX);
  this_01 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar5 = this_01->_M_use_count;
    this_02 = (torrent *)0x0;
    do {
      if (iVar5 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0024466d;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar10 = iVar5 == iVar1;
      if (bVar10) {
        this_01->_M_use_count = iVar5 + 1;
        iVar1 = iVar5;
      }
      iVar5 = iVar1;
      UNLOCK();
    } while (!bVar10);
    if (this_01->_M_use_count != 0) {
      this_02 = (this->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      goto LAB_0024466d;
    }
  }
  this_02 = (torrent *)0x0;
LAB_0024466d:
  peer_log(this,incoming_message,"ALLOWED_FAST","%d",(ulong)(uint)index.m_val);
  p_Var9 = (_List_node_base *)&this->m_extensions;
  do {
    p_Var9 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var9 == (_List_node_base *)&this->m_extensions) {
      iVar5 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
      if ((char)iVar5 != '\0') break;
      if (index.m_val < 0) {
        peer_log(this,incoming_message,"INVALID_ALLOWED_FAST","%d",(ulong)(uint)index.m_val);
        break;
      }
      if ((((this_02->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length < 1) {
LAB_002446fa:
        __position._M_current =
             (this->m_allowed_fast).
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_allowed_fast).
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
          ::
          _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                    ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                      *)&this->m_allowed_fast,__position,
                     (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                     ((long)&uStack_38 + 4));
        }
        else {
          (__position._M_current)->m_val = index.m_val;
          (this->m_allowed_fast).
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (this->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
        if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
            _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
          iVar5 = 0;
        }
        else {
          iVar5 = *(int *)_Var2._M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        }
        if (uStack_38._4_4_ < iVar5) {
          pVar6.m_val = uStack_38._4_4_ + 0x1f;
          if (-1 < uStack_38) {
            pVar6.m_val = uStack_38._4_4_;
          }
          uVar7 = 0x80000000 >> ((byte)((ulong)uStack_38 >> 0x20) & 0x1f);
          if (((((*(uint *)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                           ((long)(pVar6.m_val >> 5) + 1) * 4) &
                 (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18))
                 != 0) && (bVar10 = torrent::has_piece_passed(this_02,uStack_38._4_4_), !bVar10)) &&
              (0 < (((this_02->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_piece_length)) &&
             (this_00._M_head_impl =
                   (this_02->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
             this_00._M_head_impl != (piece_picker *)0x0)) {
            dVar4 = piece_picker::piece_priority(this_00._M_head_impl,uStack_38._4_4_);
            if (dVar4.m_val != '\0') {
              torrent::peer_is_interesting(this_02,this);
            }
          }
        }
      }
      else {
        _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (this->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
        if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
            _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar7 = *(uint *)_Var2._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
          uVar8 = (ulong)uVar7;
          if (index.m_val < (int)uVar7) {
            bVar10 = torrent::have_piece(this_02,index);
            if (!bVar10) goto LAB_002446fa;
            break;
          }
        }
        peer_log(this,incoming_message,"INVALID_ALLOWED_FAST","%d s: %d",(ulong)(uint)index.m_val,
                 uVar8);
      }
      break;
    }
    cVar3 = (**(code **)(*(long *)p_Var9[1]._M_next + 0x88))();
  } while (cVar3 == '\0');
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void peer_connection::incoming_allowed_fast(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "ALLOWED_FAST", "%d"
			, static_cast<int>(index));
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_allowed_fast(index)) return;
		}
#endif
		if (is_disconnecting()) return;

		if (index < piece_index_t(0))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "INVALID_ALLOWED_FAST"
				, "%d", static_cast<int>(index));
#endif
			return;
		}

		if (t->valid_metadata())
		{
			if (index >= m_have_piece.end_index())
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "INVALID_ALLOWED_FAST"
					, "%d s: %d", static_cast<int>(index), m_have_piece.size());
#endif
				return;
			}

			// if we already have the piece, we can
			// ignore this message
			if (t->have_piece(index))
				return;
		}

		// if we don't have the metadata, we'll verify
		// this piece index later
		m_allowed_fast.push_back(index);

		// if the peer has the piece and we want
		// to download it, request it
		if (index < m_have_piece.end_index()
			&& m_have_piece[index]
			&& !t->has_piece_passed(index)
			&& t->valid_metadata()
			&& t->has_picker()
			&& t->picker().piece_priority(index) > dont_download)
		{
			t->peer_is_interesting(*this);
		}
	}